

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  MessageLite *in_R8;
  string_view action;
  LogMessage LStack_38;
  string local_28;
  
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0xcd);
  action._M_str = (char *)this;
  action._M_len = (size_t)"parse";
  protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_28,(_anonymous_namespace_ *)0x5,action,in_R8);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_38);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  ABSL_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}